

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sidebar.c
# Opt level: O0

void draw_sidebar_divider(void)

{
  attr_t attrs;
  wchar_t local_1c;
  attr_t frame_attr;
  wchar_t sbwidth;
  wchar_t flheight;
  wchar_t invheight;
  
  if ((flooritems != (nh_objitem *)0x0) && (inventory != (nh_objitem *)0x0)) {
    split_sidebar(&sbwidth,(wchar_t *)&frame_attr);
    if (sidebar == (WINDOW_conflict *)0x0) {
      local_1c = L'\xffffffff';
    }
    else {
      local_1c = sidebar->_maxx + L'\x01';
    }
    attrs = frame_hp_color();
    nh_box_mvwhline((WINDOW *)sidebar,sbwidth,L'\0',local_1c,attrs);
  }
  return;
}

Assistant:

void draw_sidebar_divider(void)
{
    int invheight, flheight, sbwidth;
    attr_t frame_attr;

    if (!flooritems || !inventory)
	return;

    split_sidebar(&invheight, &flheight);
    sbwidth = getmaxx(sidebar);

    frame_attr = frame_hp_color();
    nh_box_mvwhline(sidebar, invheight, 0, sbwidth, frame_attr);
}